

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-split.cpp
# Opt level: O3

void __thiscall
split_strategy::split_strategy
          (split_strategy *this,split_params *params,ifstream *f_input,gguf_context *ctx_gguf,
          ggml_context *ctx_meta)

{
  pointer pcVar1;
  iterator __position;
  undefined4 uVar2;
  undefined4 uVar3;
  split_mode sVar4;
  undefined2 uVar5;
  bool bVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  gguf_context **ctx;
  long lVar11;
  pointer ppgVar12;
  size_t sVar13;
  pointer ppgVar14;
  gguf_context *ctx_out;
  int i_split;
  anon_class_32_4_220f47be new_ctx_out;
  gguf_context *local_68;
  gguf_context *local_60;
  int local_54;
  anon_class_32_4_220f47be local_50;
  
  (this->params).n_split_tensors = params->n_split_tensors;
  sVar4 = params->mode;
  uVar5 = *(undefined2 *)&params->field_0x2;
  uVar2 = *(undefined4 *)&params->field_0x4;
  sVar13 = params->n_bytes_split;
  uVar3 = *(undefined4 *)((long)&params->n_bytes_split + 4);
  (this->params).operation = params->operation;
  (this->params).mode = sVar4;
  *(undefined2 *)&(this->params).field_0x2 = uVar5;
  *(undefined4 *)&(this->params).field_0x4 = uVar2;
  *(int *)&(this->params).n_bytes_split = (int)sVar13;
  *(undefined4 *)((long)&(this->params).n_bytes_split + 4) = uVar3;
  (this->params).input._M_dataplus._M_p = (pointer)&(this->params).input.field_2;
  pcVar1 = (params->input)._M_dataplus._M_p;
  local_60 = ctx_gguf;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->params).input,pcVar1,pcVar1 + (params->input)._M_string_length);
  (this->params).output._M_dataplus._M_p = (pointer)&(this->params).output.field_2;
  pcVar1 = (params->output)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->params).output,pcVar1,pcVar1 + (params->output)._M_string_length);
  bVar6 = params->dry_run;
  (this->params).no_tensor_first_split = params->no_tensor_first_split;
  (this->params).dry_run = bVar6;
  this->f_input = f_input;
  this->ctx_gguf = ctx_gguf;
  this->ctx_meta = ctx_meta;
  iVar7 = gguf_get_n_tensors(ctx_gguf);
  this->n_tensors = iVar7;
  (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.i_split = &local_54;
  local_54 = -1;
  local_50.ctx_out = &local_68;
  local_68 = (gguf_context *)0x0;
  local_50.ctx_gguf = &local_60;
  local_50.this = this;
  split_strategy::anon_class_32_4_220f47be::operator()(&local_50,false);
  if (params->no_tensor_first_split == true) {
    split_strategy::anon_class_32_4_220f47be::operator()(&local_50,true);
  }
  if (0 < this->n_tensors) {
    lVar11 = 0;
    sVar13 = 0;
    do {
      uVar8 = gguf_get_tensor_name(local_60,lVar11);
      uVar8 = ggml_get_tensor(ctx_meta,uVar8);
      lVar9 = ggml_nbytes(uVar8);
      uVar10 = lVar9 + 0x1fU & 0xffffffffffffffe0;
      sVar13 = sVar13 + uVar10;
      bVar6 = should_split(this,(int)lVar11,sVar13);
      if (bVar6) {
        split_strategy::anon_class_32_4_220f47be::operator()(&local_50,false);
        sVar13 = uVar10;
      }
      gguf_add_tensor(local_68,uVar8);
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->n_tensors);
  }
  __position._M_current =
       (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<gguf_context*,std::allocator<gguf_context*>>::_M_realloc_insert<gguf_context*const&>
              ((vector<gguf_context*,std::allocator<gguf_context*>> *)&this->ctx_outs,__position,
               &local_68);
    ppgVar14 = (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = local_68;
    ppgVar14 = (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppgVar14;
  }
  for (ppgVar12 = (this->ctx_outs).
                  super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppgVar12 != ppgVar14; ppgVar12 = ppgVar12 + 1) {
    gguf_set_val_u16(*ppgVar12,"split.count",
                     (uint)(*(int *)&(this->ctx_outs).
                                     super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->ctx_outs).
                                    super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff);
  }
  return;
}

Assistant:

split_strategy(const split_params & params,
            std::ifstream & f_input,
            struct gguf_context * ctx_gguf,
            struct ggml_context * ctx_meta) :
        params(params),
        f_input(f_input),
        ctx_gguf(ctx_gguf),
        ctx_meta(ctx_meta),
        n_tensors(gguf_get_n_tensors(ctx_gguf)) {

        // because we need to know list of tensors for each file in advance, we will build all the ctx_out for all output splits
        int i_split = -1;
        struct gguf_context * ctx_out = NULL;
        auto new_ctx_out = [&](bool allow_no_tensors) {
            i_split++;
            if (ctx_out != NULL) {
                if (gguf_get_n_tensors(ctx_out) == 0 && !allow_no_tensors) {
                    fprintf(stderr, "error: one of splits have 0 tensors. Maybe size or tensors limit is too small\n");
                    exit(EXIT_FAILURE);
                }
                ctx_outs.push_back(ctx_out);
            }
            ctx_out = gguf_init_empty();
            // Save all metadata in first split only
            if (i_split == 0) {
                gguf_set_kv(ctx_out, ctx_gguf);
            }
            gguf_set_val_u16(ctx_out, LLM_KV_SPLIT_NO, i_split);
            gguf_set_val_u16(ctx_out, LLM_KV_SPLIT_COUNT, 0); // placeholder
            gguf_set_val_i32(ctx_out, LLM_KV_SPLIT_TENSORS_COUNT, n_tensors);
        };

        // initialize ctx_out for the first split
        new_ctx_out(false);

        // skip first split if no_tensor_first_split is set
        if (params.no_tensor_first_split) {
            new_ctx_out(true);
        }

        // process tensors one by one
        size_t curr_tensors_size = 0; // current size by counting only tensors size (without metadata)
        for (int i = 0; i < n_tensors; ++i) {
            struct ggml_tensor * t = ggml_get_tensor(ctx_meta, gguf_get_tensor_name(ctx_gguf, i));
            // calculate the "imaginary" size = the current size + next tensor size
            size_t n_bytes = GGML_PAD(ggml_nbytes(t), GGUF_DEFAULT_ALIGNMENT);
            size_t next_tensors_size = curr_tensors_size + n_bytes;
            if (should_split(i, next_tensors_size)) {
                new_ctx_out(false);
                curr_tensors_size = n_bytes;
            } else {
                curr_tensors_size = next_tensors_size;
            }
            gguf_add_tensor(ctx_out, t);
        }

        // push the last ctx_out
        ctx_outs.push_back(ctx_out);

        // set the correct n_split for all ctx_out
        for (auto & ctx : ctx_outs) {
            gguf_set_val_u16(ctx, LLM_KV_SPLIT_COUNT, ctx_outs.size());
        }
    }